

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowererMDArch.cpp
# Opt level: O2

bool __thiscall LowererMDArch::GenerateFastDivAndRem_Signed(LowererMDArch *this,Instr *instrDiv)

{
  Opnd *dst;
  Opnd *src1;
  Opnd *this_00;
  code *pcVar1;
  bool bVar2;
  uint32 uVar3;
  uint32 uVar4;
  undefined4 *puVar5;
  IntConstOpnd *pIVar6;
  RegOpnd *dst_00;
  JITTimeFunctionBody *this_01;
  RegOpnd *pRVar7;
  RegOpnd *dst_01;
  Instr *instr;
  ulong value;
  DivMagicNumber DVar8;
  
  if ((instrDiv->m_opcode != Div_I4) && (instrDiv->m_opcode != Rem_I4)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                       ,0xb6c,
                       "(instrDiv->m_opcode == Js::OpCode::Div_I4 || instrDiv->m_opcode == Js::OpCode::Rem_I4)"
                       ,
                       "instrDiv->m_opcode == Js::OpCode::Div_I4 || instrDiv->m_opcode == Js::OpCode::Rem_I4"
                      );
    if (!bVar2) goto LAB_005d0ca1;
    *puVar5 = 0;
  }
  dst = instrDiv->m_dst;
  src1 = instrDiv->m_src1;
  this_00 = instrDiv->m_src2;
  pIVar6 = IR::Opnd::AsIntConstOpnd(this_00);
  uVar3 = IR::IntConstOpnd::AsInt32(pIVar6);
  dst_00 = IR::RegOpnd::New(TyInt32,this->m_func);
  if (this_00->m_type != TyInt32) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                       ,0xb76,"(divisor->GetType() == TyInt32)","divisor->GetType() == TyInt32");
    if (!bVar2) {
LAB_005d0ca1:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  uVar4 = -uVar3;
  if (0 < (int)uVar3) {
    uVar4 = uVar3;
  }
  if (uVar4 + 0x80000001 < 0x80000002) {
LAB_005d0a00:
    bVar2 = false;
  }
  else {
    if (uVar4 == 1) {
      this_01 = Func::GetJITFunctionBody(this->m_func);
      bVar2 = JITTimeFunctionBody::IsWasmFunction(this_01);
      if (((int)uVar3 < 0) && (bVar2)) goto LAB_005d0a00;
      Lowerer::InsertMove(dst,src1,instrDiv,true);
    }
    else if ((uVar4 + 0x7fffffff & uVar4) == 0) {
      uVar4 = Math::Log2(uVar4);
      pIVar6 = IR::IntConstOpnd::New((long)(int)(uVar4 - 1),TyInt8,this->m_func,false);
      Lowerer::InsertShift(Shr_A,false,&dst_00->super_Opnd,src1,&pIVar6->super_Opnd,instrDiv);
      pIVar6 = IR::IntConstOpnd::New((long)(int)(0x20 - uVar4),TyInt8,this->m_func,false);
      Lowerer::InsertShift
                (ShrU_A,false,&dst_00->super_Opnd,&dst_00->super_Opnd,&pIVar6->super_Opnd,instrDiv);
      Lowerer::InsertAdd(false,&dst_00->super_Opnd,&dst_00->super_Opnd,src1,instrDiv);
      pIVar6 = IR::IntConstOpnd::New((long)(int)uVar4,TyInt8,this->m_func,false);
      Lowerer::InsertShift(Shr_A,false,dst,&dst_00->super_Opnd,&pIVar6->super_Opnd,instrDiv);
    }
    else {
      DVar8 = Js::NumberUtilities::GenerateDivMagicNumber(uVar4);
      pRVar7 = IR::RegOpnd::New(TyInt64,this->m_func);
      dst_01 = IR::RegOpnd::New(TyInt64,this->m_func);
      Lowerer::InsertMove(&dst_01->super_Opnd,src1,instrDiv,true);
      pIVar6 = IR::IntConstOpnd::New((long)DVar8.multiplier,TyInt32,this->m_func,false);
      instr = IR::Instr::New(IMUL2,&pRVar7->super_Opnd,&pIVar6->super_Opnd,&dst_01->super_Opnd,
                             this->m_func);
      IR::Instr::InsertBefore(instrDiv,instr);
      LowererMD::Legalize<false>(instr,false);
      pIVar6 = IR::IntConstOpnd::New(0x20,TyInt8,this->m_func,false);
      Lowerer::InsertShift
                (Shr_A,false,&pRVar7->super_Opnd,&pRVar7->super_Opnd,&pIVar6->super_Opnd,instrDiv);
      Lowerer::InsertMove(&dst_00->super_Opnd,&pRVar7->super_Opnd,instrDiv,true);
      if (DVar8.multiplier < 0) {
        Lowerer::InsertAdd(false,&dst_00->super_Opnd,&dst_00->super_Opnd,src1,instrDiv);
      }
      value = DVar8._0_8_ >> 0x20;
      if (value != 0) {
        pIVar6 = IR::IntConstOpnd::New(value,TyInt8,this->m_func,false);
        Lowerer::InsertShift
                  (Shr_A,false,&dst_00->super_Opnd,&dst_00->super_Opnd,&pIVar6->super_Opnd,instrDiv)
        ;
      }
      pRVar7 = IR::RegOpnd::New(TyInt32,this->m_func);
      Lowerer::InsertMove(&pRVar7->super_Opnd,src1,instrDiv,true);
      pIVar6 = IR::IntConstOpnd::New(0x1f,TyInt8,this->m_func,false);
      Lowerer::InsertShift
                (ShrU_A,false,&pRVar7->super_Opnd,&pRVar7->super_Opnd,&pIVar6->super_Opnd,instrDiv);
      Lowerer::InsertAdd(false,dst,&dst_00->super_Opnd,&pRVar7->super_Opnd,instrDiv);
    }
    bVar2 = true;
    if ((int)uVar3 < 0) {
      pIVar6 = IR::IntConstOpnd::New(0,TyInt8,this->m_func,false);
      Lowerer::InsertSub(false,dst,&pIVar6->super_Opnd,dst,instrDiv);
    }
  }
  return bVar2;
}

Assistant:

bool LowererMDArch::GenerateFastDivAndRem_Signed(IR::Instr* instrDiv)
{
    Assert(instrDiv->m_opcode == Js::OpCode::Div_I4 || instrDiv->m_opcode == Js::OpCode::Rem_I4);

    IR::Opnd* divident  = instrDiv->GetSrc1(); // nominator
    IR::Opnd* divisor   = instrDiv->GetSrc2(); // denominator
    IR::Opnd* dst       = instrDiv->GetDst();
    int constDivisor    = divisor->AsIntConstOpnd()->AsInt32();
    IR::Opnd* result = IR::RegOpnd::New(TyInt32, this->m_func);

    bool isNegDevisor   = false;

    Assert(divisor->GetType() == TyInt32); // constopnd->AsInt32() currently does silent casts between int32 and uint32

    if (constDivisor < 0)
    {
        isNegDevisor = true;
        constDivisor *= -1;
    }

    if (constDivisor <= 0 || constDivisor > INT32_MAX - 1)
    {
        return false;
    }
    if (constDivisor == 1)
    {
        // Wasm expects x/-1 not to be folded to -x.
        if (m_func->GetJITFunctionBody()->IsWasmFunction() && isNegDevisor == true)
        {
            return false;
        }
        Lowerer::InsertMove(dst, divident, instrDiv);
    }
    else if (Math::IsPow2(constDivisor)) // Power of two
    {
        // Negative dividents needs the result incremented by 1
        // Following sequence avoids branch
        // For q = n/d and d = 2^k

        //      sar q n k-1   //2^(k-1) if n < 0 else 0
        //      shr q q 32-k
        //      add q q n
        //      sar q q k

        int k = Math::Log2(constDivisor);
        Lowerer::InsertShift(Js::OpCode::Shr_A, false, result, divident, IR::IntConstOpnd::New(k - 1, TyInt8, this->m_func), instrDiv);
        Lowerer::InsertShift(Js::OpCode::ShrU_A, false, result, result, IR::IntConstOpnd::New(32 - k, TyInt8, this->m_func), instrDiv);
        Lowerer::InsertAdd(false, result, result, divident, instrDiv);
        Lowerer::InsertShift(Js::OpCode::Shr_A, false, dst, result, IR::IntConstOpnd::New(k, TyInt8, this->m_func), instrDiv);
    }
    else
    {
        // Ref: Warren's Hacker's Delight, Chapter 10
        //
        // For q = n/d where d is a signed constant
        // Calculate magic_number (multiplier) and shift amounts (shiftAmt) and replace  div with mul and shift

        Js::NumberUtilities::DivMagicNumber magic_number(Js::NumberUtilities::GenerateDivMagicNumber(constDivisor));
        int32 multiplier = magic_number.multiplier;

        // Compute mulhs divident, multiplier
        IR::Opnd* quotient64reg = IR::RegOpnd::New(TyInt64, this->m_func);
        IR::Opnd* divident64Reg = IR::RegOpnd::New(TyInt64, this->m_func);

        Lowerer::InsertMove(divident64Reg, divident, instrDiv);
        IR::Instr* imul = IR::Instr::New(LowererMD::MDImulOpcode, quotient64reg, IR::IntConstOpnd::New(multiplier, TyInt32, this->m_func), divident64Reg, this->m_func);
        instrDiv->InsertBefore(imul);
        LowererMD::Legalize(imul);

        Lowerer::InsertShift(Js::OpCode::Shr_A, false, quotient64reg, quotient64reg, IR::IntConstOpnd::New(32, TyInt8, this->m_func), instrDiv);
        Lowerer::InsertMove(result, quotient64reg, instrDiv);

        // Special handling when divisor is of type 5 and 7.
        if (multiplier < 0)
        {
            Lowerer::InsertAdd(false, result, result, divident, instrDiv);
        }
        if (magic_number.shiftAmt > 0)
        {
            Lowerer::InsertShift(Js::OpCode::Shr_A, false, result, result, IR::IntConstOpnd::New(magic_number.shiftAmt, TyInt8, this->m_func), instrDiv);
        }
        IR::Opnd* tmpReg2 = IR::RegOpnd::New(TyInt32, this->m_func);
        Lowerer::InsertMove(tmpReg2, divident, instrDiv);

        // Add 1 if divisor is less than 0
        Lowerer::InsertShift(Js::OpCode::ShrU_A, false, tmpReg2, tmpReg2, IR::IntConstOpnd::New(31, TyInt8, this->m_func), instrDiv); // 1 if divident < 0, 0 otherwise
        Lowerer::InsertAdd(false, dst, result, tmpReg2, instrDiv);
    }

    // Negate results if divident is less than zero
    if (isNegDevisor)
    {
        Lowerer::InsertSub(false, dst, IR::IntConstOpnd::New(0, TyInt8, this->m_func), dst, instrDiv);
    }
    return true;
}